

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O2

void __thiscall TcpConnection::set_sockfd(TcpConnection *this,int *fd)

{
  uint uVar1;
  int op;
  
  uVar1 = fcntl(*fd,3,0);
  fcntl(*fd,4,(ulong)(uVar1 | 0x800));
  setsockopt(*fd,6,1,&op,4);
  return;
}

Assistant:

void TcpConnection::set_sockfd(int& fd) {
    int flag = fcntl(fd, F_GETFL, 0);
    fcntl(fd, F_SETFL, O_NONBLOCK|flag);
    int op = 1;
    setsockopt(fd, IPPROTO_TCP, TCP_NODELAY, &op, sizeof(op));
}